

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

obj * gold_at(level *lev,int x,int y)

{
  obj *local_28;
  obj *obj;
  int y_local;
  int x_local;
  level *lev_local;
  
  local_28 = lev->objects[x][y];
  while( true ) {
    if (local_28 == (obj *)0x0) {
      return (obj *)0x0;
    }
    if (local_28->oclass == '\f') break;
    local_28 = (local_28->v).v_nexthere;
  }
  return local_28;
}

Assistant:

struct obj *gold_at(struct level *lev, int x, int y)
{
	struct obj *obj = lev->objects[x][y];
	while (obj) {
	    if (obj->oclass == COIN_CLASS) return obj;
	    obj = obj->nexthere;
	}
	return NULL;
}